

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetPropertyName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *descriptor)

{
  __type _Var1;
  bool bVar2;
  string sStack_38;
  
  GetFieldName_abi_cxx11_(&sStack_38,this,descriptor);
  UnderscoresToPascalCase(__return_storage_ptr__,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  _Var1 = std::operator==(__return_storage_ptr__,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          **(undefined8 **)(this + 0x58));
  if (((!_Var1) && (bVar2 = std::operator==(__return_storage_ptr__,"Types"), !bVar2)) &&
     (bVar2 = std::operator==(__return_storage_ptr__,"Descriptor"), !bVar2)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GetPropertyName(const FieldDescriptor* descriptor) {
  // TODO(jtattermusch): consider introducing csharp_property_name field option
  std::string property_name = UnderscoresToPascalCase(GetFieldName(descriptor));
  // Avoid either our own type name or reserved names. Note that not all names
  // are reserved - a field called to_string, write_to etc would still cause a problem.
  // There are various ways of ending up with naming collisions, but we try to avoid obvious
  // ones.
  if (property_name == descriptor->containing_type()->name()
      || property_name == "Types"
      || property_name == "Descriptor") {
    property_name += "_";
  }
  return property_name;
}